

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

char * __thiscall
CClient::LoadMapSearch(CClient *this,char *pMapName,SHA256_DIGEST *pWantedSha256,int WantedCrc)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  char aFilename [128];
  char aWanted [81];
  char aBuf [512];
  char local_338 [128];
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  char local_298 [96];
  char local_238 [512];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_298[0] = '\0';
  if (pWantedSha256 != (SHA256_DIGEST *)0x0) {
    local_2b8 = *(undefined8 *)pWantedSha256->data;
    uStack_2b0 = *(undefined8 *)(pWantedSha256->data + 8);
    local_2a8 = *(undefined8 *)(pWantedSha256->data + 0x10);
    uStack_2a0 = *(undefined8 *)(pWantedSha256->data + 0x18);
    sha256_str(*(SHA256_DIGEST *)pWantedSha256->data,local_238,0x41);
    str_format(local_298,0x51,"sha256=%s ",local_238);
  }
  iVar1 = WantedCrc;
  str_format(local_238,0x200,"loading map, map=%s wanted %scrc=%08x",pMapName,local_298);
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
            (this->m_pConsole,1,"client",local_238,0);
  SetState(this,2);
  str_format(local_238,0x200,"maps/%s.map",pMapName);
  pcVar2 = LoadMap(this,pMapName,local_238,pWantedSha256,WantedCrc);
  pcVar3 = (char *)0x0;
  if (pcVar2 != (char *)0x0) {
    FormatMapDownloadFilename(pMapName,pWantedSha256,WantedCrc,false,local_238,iVar1);
    pcVar2 = LoadMap(this,pMapName,local_238,pWantedSha256,WantedCrc);
    pcVar3 = (char *)0x0;
    if (pcVar2 != (char *)0x0) {
      if (pWantedSha256 != (SHA256_DIGEST *)0x0) {
        str_copy(local_338,".map",0x20);
        str_format(local_238,0x200,"downloadedmaps/%s_%08x%s",pMapName,(ulong)(uint)WantedCrc,
                   local_338);
        pcVar2 = LoadMap(this,pMapName,local_238,pWantedSha256,WantedCrc);
        if (pcVar2 == (char *)0x0) {
          pcVar3 = (char *)0x0;
          goto LAB_00120aa3;
        }
      }
      str_format(local_338,0x80,"%s.map",pMapName);
      iVar1 = (*(this->m_pStorage->super_IInterface)._vptr_IInterface[7])
                        (this->m_pStorage,local_338,"maps",0xffffffff,local_238,0x200);
      pcVar3 = pcVar2;
      if ((char)iVar1 != '\0') {
        pcVar3 = LoadMap(this,pMapName,local_238,pWantedSha256,WantedCrc);
      }
    }
  }
LAB_00120aa3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pcVar3;
  }
  __stack_chk_fail();
}

Assistant:

const char *CClient::LoadMapSearch(const char *pMapName, const SHA256_DIGEST *pWantedSha256, int WantedCrc)
{
	const char *pError = 0;
	char aBuf[512];
	char aWanted[SHA256_MAXSTRSIZE + 16];
	aWanted[0] = 0;
	if(pWantedSha256)
	{
		char aWantedSha256[SHA256_MAXSTRSIZE];
		sha256_str(*pWantedSha256, aWantedSha256, sizeof(aWantedSha256));
		str_format(aWanted, sizeof(aWanted), "sha256=%s ", aWantedSha256);
	}
	str_format(aBuf, sizeof(aBuf), "loading map, map=%s wanted %scrc=%08x", pMapName, aWanted, WantedCrc);
	m_pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", aBuf);
	SetState(IClient::STATE_LOADING);

	// try the normal maps folder
	str_format(aBuf, sizeof(aBuf), "maps/%s.map", pMapName);
	pError = LoadMap(pMapName, aBuf, pWantedSha256, WantedCrc);
	if(!pError)
		return pError;

	// try the downloaded maps
	FormatMapDownloadFilename(pMapName, pWantedSha256, WantedCrc, false, aBuf, sizeof(aBuf));
	pError = LoadMap(pMapName, aBuf, pWantedSha256, WantedCrc);
	if(!pError)
		return pError;

	// backward compatibility with old names
	if(pWantedSha256)
	{
		FormatMapDownloadFilename(pMapName, 0, WantedCrc, false, aBuf, sizeof(aBuf));
		pError = LoadMap(pMapName, aBuf, pWantedSha256, WantedCrc);
		if(!pError)
			return pError;
	}

	// search for the map within subfolders
	char aFilename[128];
	str_format(aFilename, sizeof(aFilename), "%s.map", pMapName);
	if(Storage()->FindFile(aFilename, "maps", IStorage::TYPE_ALL, aBuf, sizeof(aBuf)))
		pError = LoadMap(pMapName, aBuf, pWantedSha256, WantedCrc);

	return pError;
}